

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave_header.cpp
# Opt level: O2

void cinemo::wh::printWaveHeader(WaveHeader *wh)

{
  undefined4 uVar1;
  long lVar2;
  ostream *poVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  int i;
  long lVar5;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"-------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Wave Header Information");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"File: \t");
  poVar3 = std::operator<<(poVar3,(string *)wh);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Total size: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," Bytes");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Riff Size: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," Bytes");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Wave ID: ");
  poVar3 = std::operator<<(poVar3,(string *)&wh->WaveId);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Format Size: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," Bytes");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"AudioType: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,wh->FormatAudioType);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Channels: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,wh->NumberOfChannels);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Sample Rate: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," Hz");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Byte Rate: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," Bps");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Block Align: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,wh->BlockAlign);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Bits per Sample: \t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,wh->BitsPerSample);
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Extension Size: \t");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,wh->ExtensionSize);
  std::endl<char,std::char_traits<char>>(poVar3);
  if (wh->ExtensionSize != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\tExt. Valid Bits Per Sample: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,wh->ValidBitsPerSample);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"\tExt. Channel Mask: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    std::operator<<((ostream *)&std::cout,"\tGUID: ");
    uVar1 = *(undefined4 *)(std::ostream::write + *(long *)(std::cout + -0x18));
    for (lVar5 = 0; lVar5 < (long)((ulong)wh->ExtensionSize - 6); lVar5 = lVar5 + 1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"0x");
      poVar3 = std::operator<<(poVar3,0x30);
      lVar2 = *(long *)poVar3;
      *(undefined8 *)(poVar3 + *(long *)(lVar2 + -0x18) + 0x10) = 2;
      lVar2 = *(long *)(lVar2 + -0x18);
      *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 8;
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(uint)wh->SubFormat[lVar5]);
      std::operator<<(poVar3," ");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    *(undefined4 *)(std::ostream::write + *(long *)(std::cout + -0x18)) = uVar1;
  }
  if (wh->HasFact == true) {
    poVar3 = std::operator<<((ostream *)&std::cout,"FACT Details: ");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"\tSize: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"\tSample Length: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," Bytes");
    std::endl<char,std::char_traits<char>>(poVar3);
    if (4 < wh->FactSize) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "\tNote: there is information which have been skipped!");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Data Size: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3," Bytes");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = std::operator<<((ostream *)&std::cout,"Data Begins: ");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::endl<char,std::char_traits<char>>(poVar3);
  if (wh->hasList == true) {
    poVar3 = std::operator<<((ostream *)&std::cout,"LIST Size: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  if ((wh->WarningFlags).super__Base_bitset<1UL>._M_w != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Warning Flags: ");
    pbVar4 = std::operator<<(poVar3,&wh->WarningFlags);
    std::endl<char,std::char_traits<char>>(pbVar4);
  }
  if ((wh->ErrorFlags).super__Base_bitset<1UL>._M_w != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Error Flags: ");
    pbVar4 = std::operator<<(poVar3,&wh->ErrorFlags);
    std::endl<char,std::char_traits<char>>(pbVar4);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"-------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void printWaveHeader(const WaveHeader& wh) {

            cout << "-------------------------------------" << endl;
            cout << "Wave Header Information" << endl;
            cout << "File: \t" << wh.File << endl;
            cout << "Total size: " << wh.FileSize << " Bytes" << endl;
            cout << "Riff Size: " << wh.RiffSize << " Bytes" << endl;
            cout << "Wave ID: " << wh.WaveId << endl;
            cout << "Format Size: " << wh.FormatSize << " Bytes" << endl;
            cout << "AudioType: " << wh.FormatAudioType << endl;
            cout << "Channels: " << wh.NumberOfChannels << endl;
            cout << "Sample Rate: " << wh.SampleRate << " Hz" << endl;
            cout << "Byte Rate: " << wh.ByteRate << " Bps" << endl;
            cout << "Block Align: " << wh.BlockAlign << endl;
            cout << "Bits per Sample: \t" << wh.BitsPerSample << endl;
            cout << "Extension Size: \t" << wh.ExtensionSize << endl;
            if (wh.isExtendedFormat()) {
                cout << "\tExt. Valid Bits Per Sample: "
                     << wh.ValidBitsPerSample
                     << endl;
                cout << "\tExt. Channel Mask: " << wh.ChannelMask << endl;
                cout << "\tGUID: ";
                auto flags = cout.flags(); //keep current console flags
                for (int i = 0; i < wh.ExtensionSize - 6; i++) {
                    cout << "0x" << std::setfill('0') << std::setw(2)
                         << std::hex << +wh.SubFormat[i] << " ";
                }
                cout << endl;
                cout.flags(flags);
            }
            if (wh.HasFact) {
                cout << "FACT Details: " << endl;
                cout << "\tSize: " << wh.FactSize << endl;
                cout << "\tSample Length: " << wh.FactSampleLength << " Bytes"
                     << endl;
                if (wh.FactSize > 4) { //standard is 4...but there maybe more
                    cout
                            << "\tNote: there is information which have been skipped!"
                            << endl;
                }
            }
            cout << "Data Size: " << wh.DataSize << " Bytes" << endl;
            cout << "Data Begins: " << wh.DataBegin << endl;
            if (wh.hasList) {
                cout << "LIST Size: " << wh.ListSize << endl;
            }
            if (wh.WarningFlags.any()) {
                cout << "Warning Flags: " << wh.WarningFlags << endl;
            }
            if (wh.ErrorFlags.any()) {
                cout << "Error Flags: " << wh.ErrorFlags << endl;
            }
            cout << "-------------------------------------" << endl;
        }